

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_client_transporter.cpp
# Opt level: O2

int __thiscall SocketClientTransporter::Stop(SocketClientTransporter *this)

{
  bool bVar1;
  
  Transporter::Stop(&this->super_Transporter);
  bVar1 = Transporter::IsConnected(&this->super_Transporter);
  if (bVar1) {
    uv_read_stop((uv_stream_t *)&this->uvClient);
    uv_close((uv_handle_t *)&this->uvClient,(uv_close_cb)0x0);
  }
  std::condition_variable::notify_all();
  return 0;
}

Assistant:

int SocketClientTransporter::Stop() {
	Transporter::Stop();
	if (IsConnected()) {
		uv_read_stop((uv_stream_t*)&uvClient);
		uv_close((uv_handle_t*)&uvClient, nullptr);
	}
	cv.notify_all();
	return 0;
}